

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_prev(void *p,HistEvent_conflict *ev)

{
  undefined8 *puVar1;
  uint uVar2;
  char *pcVar3;
  
  if (*(void **)((long)p + 0x28) == p) {
    uVar2 = (0 < *(int *)((long)p + 0x34)) + 5;
    ev->num = uVar2;
    pcVar3 = he_errlist[uVar2];
  }
  else {
    puVar1 = *(undefined8 **)((long)*(void **)((long)p + 0x28) + 0x20);
    if (puVar1 != (undefined8 *)p) {
      *(undefined8 **)((long)p + 0x28) = puVar1;
      pcVar3 = (char *)puVar1[1];
      *(undefined8 *)ev = *puVar1;
      ev->str = pcVar3;
      return 0;
    }
    ev->num = 7;
    pcVar3 = "no previous event";
  }
  ev->str = pcVar3;
  return -1;
}

Assistant:

static int
history_def_prev(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	if (h->cursor == &h->list) {
		he_seterrev(ev,
		    (h->cur > 0) ? _HE_END_REACHED : _HE_EMPTY_LIST);
		return -1;
	}

	if (h->cursor->prev == &h->list) {
		he_seterrev(ev, _HE_START_REACHED);
		return -1;
	}

        h->cursor = h->cursor->prev;
        *ev = h->cursor->ev;

	return 0;
}